

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

dsListEntry * dsListNext(dsListEntry *entry)

{
  dsListEntry *entry_local;
  
  if (entry->nextOffset == 0xffffffffffffffff) {
    entry_local = (dsListEntry *)0x0;
  }
  else {
    dsRunLogCallback("%s(): next: %lu\n","dsListNext",entry->nextOffset);
    entry_local = (dsListEntry *)dsPtr(entry->nextOffset,0x20);
    if (entry_local == (dsListEntry *)0x0) {
      dsRunLogCallback("%s(): Can\'t map next list entry.\n","dsListNext");
      entry_local = (dsListEntry *)0x0;
    }
  }
  return entry_local;
}

Assistant:

dsListEntry *
dsListNext(dsListEntry *entry)
{
	if (entry->nextOffset == UINT64_MAX) {
		return(NULL);
	}

	dsLog("next: %" PRIu64 "\n", entry->nextOffset);

	if ((entry = dsPtr(entry->nextOffset, sizeof(*entry))) == NULL) {
		dsLog("Can't map next list entry.\n");
		return(NULL);
	}

	return(entry);
}